

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall
fmt::v5::anon_unknown_10::format_error_code
          (anon_unknown_10 *this,buffer *out,int error_code,string_view message)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 in_register_00000014;
  uint value;
  long lVar8;
  basic_buffer<char> *c;
  writer w;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_38;
  
  pcVar6 = message.data_;
  value = (uint)out;
  lVar8 = 0;
  *(undefined8 *)(this + 0x10) = 0;
  uVar3 = -value;
  if (0 < (int)value) {
    uVar3 = value;
  }
  uVar5 = 0x1f;
  if ((uVar3 | 1) != 0) {
    for (; (uVar3 | 1) >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar5 = (uVar5 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  local_38.locale_.locale_ = (void *)0x0;
  pcVar7 = (char *)(0x1ec - ((((ulong)out & 0xffffffff) >> 0x1f) +
                            (ulong)((uVar5 - (uVar3 < *(uint *)(internal::basic_data<void>::
                                                                ZERO_OR_POWERS_OF_10_32 +
                                                               (ulong)uVar5 * 4))) + 1)));
  local_38.out_.container = (basic_buffer<char> *)this;
  if (pcVar7 < pcVar6) goto LAB_0010b1f7;
  pcVar4 = *(char **)(this + 0x18);
  if (pcVar4 < pcVar6) {
    (*(code *)**(undefined8 **)this)
              (this,pcVar6,(void *)CONCAT44(in_register_00000014,error_code),pcVar7,message.size_);
    *(char **)(this + 0x10) = pcVar6;
LAB_0010b1b8:
    memmove(*(void **)(this + 8),(void *)CONCAT44(in_register_00000014,error_code),(size_t)pcVar6);
    lVar8 = *(long *)(this + 0x10);
    pcVar4 = *(char **)(this + 0x18);
  }
  else {
    *(char **)(this + 0x10) = pcVar6;
    if (pcVar6 != (char *)0x0) goto LAB_0010b1b8;
    lVar8 = 0;
  }
  pcVar6 = (char *)(lVar8 + 2);
  if (pcVar4 < pcVar6) {
    (*(code *)**(undefined8 **)this)(this,pcVar6);
  }
  *(char **)(this + 0x10) = pcVar6;
  *(undefined2 *)(*(long *)(this + 8) + lVar8) = 0x203a;
  lVar8 = *(long *)(this + 0x10);
LAB_0010b1f7:
  uVar1 = lVar8 + 6;
  if (*(ulong *)(this + 0x18) < uVar1) {
    (*(code *)**(undefined8 **)this)(this,uVar1);
  }
  *(ulong *)(this + 0x10) = uVar1;
  lVar2 = *(long *)(this + 8);
  *(undefined2 *)(lVar2 + 4 + lVar8) = 0x2072;
  *(undefined4 *)(lVar2 + lVar8) = 0x6f727265;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  write_decimal<int>(&local_38,value);
  return;
}

Assistant:

void format_error_code(internal::buffer &out, int error_code,
                       string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  std::size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  typedef internal::int_traits<int>::main_type main_type;
  main_type abs_value = static_cast<main_type>(error_code);
  if (internal::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += internal::to_unsigned(internal::count_digits(abs_value));
  writer w(out);
  if (message.size() <= inline_buffer_size - error_code_size) {
    w.write(message);
    w.write(SEP);
  }
  w.write(ERROR_STR);
  w.write(error_code);
  assert(out.size() <= inline_buffer_size);
}